

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktWsiTests.cpp
# Opt level: O0

void vkt::wsi::anon_unknown_1::createTypeSpecificTests(TestCaseGroup *testGroup,Type wsiType)

{
  TestCaseGroup *pTVar1;
  allocator<char> local_111;
  string local_110;
  allocator<char> local_e9;
  string local_e8;
  allocator<char> local_c1;
  string local_c0;
  allocator<char> local_99;
  string local_98;
  allocator<char> local_71;
  string local_70;
  allocator<char> local_39;
  string local_38;
  Type local_14;
  TestCaseGroup *pTStack_10;
  Type wsiType_local;
  TestCaseGroup *testGroup_local;
  
  local_14 = wsiType;
  pTStack_10 = testGroup;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"surface",&local_39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"VkSurface Tests",&local_71);
  addTestGroup<vk::wsi::Type>(testGroup,&local_38,&local_70,createSurfaceTests,local_14);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator(&local_71);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  pTVar1 = pTStack_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"swapchain",&local_99);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c0,"VkSwapchain Tests",&local_c1);
  addTestGroup<vk::wsi::Type>(pTVar1,&local_98,&local_c0,createSwapchainTests,local_14);
  std::__cxx11::string::~string((string *)&local_c0);
  std::allocator<char>::~allocator(&local_c1);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator(&local_99);
  pTVar1 = pTStack_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e8,"display_timing",&local_e9)
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_110,"Display Timing Tests",&local_111);
  addTestGroup<vk::wsi::Type>(pTVar1,&local_e8,&local_110,createDisplayTimingTests,local_14);
  std::__cxx11::string::~string((string *)&local_110);
  std::allocator<char>::~allocator(&local_111);
  std::__cxx11::string::~string((string *)&local_e8);
  std::allocator<char>::~allocator(&local_e9);
  return;
}

Assistant:

void createTypeSpecificTests (tcu::TestCaseGroup* testGroup, vk::wsi::Type wsiType)
{
	addTestGroup(testGroup, "surface",				"VkSurface Tests",				createSurfaceTests,				wsiType);
	addTestGroup(testGroup, "swapchain",			"VkSwapchain Tests",			createSwapchainTests,			wsiType);
	addTestGroup(testGroup, "display_timing",		"Display Timing Tests",			createDisplayTimingTests,		wsiType);
}